

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O3

QString * __thiscall
QSqlTableModel::selectStatement(QString *__return_storage_ptr__,QSqlTableModel *this)

{
  QSqlErrorPrivate *pQVar1;
  int iVar2;
  long lVar3;
  QExplicitlySharedDataPointer<QSqlErrorPrivate> QVar4;
  Data *pDVar5;
  bool bVar6;
  QSqlDriver *pQVar7;
  QString *pQVar8;
  long *plVar9;
  QArrayData *pQVar10;
  qsizetype *pqVar11;
  char16_t **ppcVar12;
  QStringBuilder<QLatin1String,_const_QString_&> *pQVar13;
  QArrayData *pQVar14;
  long in_FS_OFFSET;
  QByteArrayView QVar15;
  QLatin1String QVar16;
  QLatin1String QVar17;
  QString local_d8;
  QSqlError local_c0;
  QString local_b8;
  QStringBuilder<QLatin1String,_const_QString_&> local_98;
  QStringBuilder<QLatin1String,_const_QString_&> local_78;
  QString local_58;
  long local_38;
  
  ppcVar12 = (char16_t **)&local_d8;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)&(this->super_QSqlQueryModel).field_0x8;
  if (*(long *)(lVar3 + 0x2a8) == 0) {
    QVar15.m_data = (storage_type *)0x13;
    QVar15.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar15);
    local_78.a.m_size = (qsizetype)local_58.d.d;
    local_78.a.m_data = (char *)local_58.d.ptr;
    local_78.b = (QString *)local_58.d.size;
    local_58.d.size = 0;
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (char16_t *)0x0;
    local_98.b = (QString *)0x0;
    local_98.a.m_size = 0;
    local_98.a.m_data = (char *)0x0;
    QSqlError::QSqlError
              ((QSqlError *)&local_b8,(QString *)&local_78,&local_58,StatementError,
               (QString *)&local_98);
    pQVar14 = *(QArrayData **)(lVar3 + 0xe0);
    *(Data **)(lVar3 + 0xe0) = local_b8.d.d;
    local_b8.d.d = (Data *)pQVar14;
    QSqlError::~QSqlError((QSqlError *)&local_b8);
    if ((QArrayData *)local_98.a.m_size != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_98.a.m_size)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_98.a.m_size)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_98.a.m_size)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_98.a.m_size,2,0x10);
      }
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_78.a.m_size != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_78.a.m_size)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_78.a.m_size)->_q_value).super___atomic_base<int>._M_i + -1;
      iVar2 = (((QBasicAtomicInt *)local_78.a.m_size)->_q_value).super___atomic_base<int>._M_i;
      UNLOCK();
      pQVar14 = (QArrayData *)local_78.a.m_size;
joined_r0x0013bd03:
      if (iVar2 == 0) {
        QArrayData::deallocate(pQVar14,2,0x10);
      }
    }
  }
  else {
    pQVar1 = (QSqlErrorPrivate *)(lVar3 + 0x298);
    bVar6 = QSqlRecord::isEmpty((QSqlRecord *)(lVar3 + 0x100));
    if (!bVar6) {
      local_78.b = (QString *)0xaaaaaaaaaaaaaaaa;
      local_78.a.m_size = -0x5555555555555556;
      local_78.a.m_data = (char *)0xaaaaaaaaaaaaaaaa;
      pQVar7 = QSqlDatabase::driver((QSqlDatabase *)(lVar3 + 0x228));
      (**(code **)(*(long *)pQVar7 + 0xa8))
                (&local_78,pQVar7,1,pQVar1,(QSqlRecord *)(lVar3 + 0x100),0);
      if ((QSqlErrorPrivate *)local_78.b == (QSqlErrorPrivate *)0x0) {
        local_98.a.m_size = 0x23;
        local_98.a.m_data = "Unable to select fields from table ";
        local_98.b = (QString *)pQVar1;
        QStringBuilder<QLatin1String,_const_QString_&>::convertTo<QString>(&local_58,&local_98);
        local_b8.d.size = 0;
        local_b8.d.d = (Data *)0x0;
        local_b8.d.ptr = (char16_t *)0x0;
        local_d8.d.size = 0;
        local_d8.d.d = (Data *)0x0;
        local_d8.d.ptr = (char16_t *)0x0;
        QSqlError::QSqlError(&local_c0,&local_58,&local_b8,StatementError,&local_d8);
        QVar4.d.ptr = (totally_ordered_wrapper<QSqlErrorPrivate_*>)
                      ((totally_ordered_wrapper<QSqlErrorPrivate_*> *)(lVar3 + 0xe0))->ptr;
        ((QExplicitlySharedDataPointer<QSqlErrorPrivate> *)(lVar3 + 0xe0))->d =
             (totally_ordered_wrapper<QSqlErrorPrivate_*>)local_c0.d.d.ptr;
        local_c0.d.d.ptr =
             (QExplicitlySharedDataPointer<QSqlErrorPrivate>)
             (QExplicitlySharedDataPointer<QSqlErrorPrivate>)QVar4.d.ptr;
        QSqlError::~QSqlError(&local_c0);
        if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
          }
        }
        (__return_storage_ptr__->d).d = (Data *)local_78.a.m_size;
        (__return_storage_ptr__->d).ptr = (char16_t *)local_78.a.m_data;
        (__return_storage_ptr__->d).size = (qsizetype)local_78.b;
        if ((QArrayData *)local_78.a.m_size != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)local_78.a.m_size)->ref_)._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)local_78.a.m_size)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
      }
      else {
        QSqlQueryModelSql::where((QString *)&local_98,(QString *)(lVar3 + 0x2b0));
        pQVar13 = &local_98;
        if (((QSqlErrorPrivate *)local_78.b == (QSqlErrorPrivate *)0x0) ||
           (pQVar13 = &local_78, (QSqlErrorPrivate *)local_98.b == (QSqlErrorPrivate *)0x0)) {
          pQVar14 = &((DataPointer *)&pQVar13->a)->d->super_QArrayData;
          local_d8.d.d = (Data *)((DataPointer *)&pQVar13->a)->ptr;
          local_c0.d.d.ptr = (QExplicitlySharedDataPointer<QSqlErrorPrivate>)pQVar13->b;
          if (pQVar14 == (QArrayData *)0x0) {
            pQVar14 = (QArrayData *)0x0;
          }
          else {
            LOCK();
            (((QArrayData *)&pQVar14->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
                 (((QArrayData *)&pQVar14->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
        }
        else {
          local_58.d.d = (Data *)local_78.a.m_size;
          local_58.d.ptr = (char16_t *)local_78.a.m_data;
          local_58.d.size = (qsizetype)local_78.b;
          if ((QArrayData *)local_78.a.m_size != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)local_78.a.m_size)->ref_)._q_value.super___atomic_base<int>._M_i =
                 (((QArrayData *)local_78.a.m_size)->ref_)._q_value.super___atomic_base<int>._M_i +
                 1;
            UNLOCK();
          }
          QVar16.m_data = (char *)0x1;
          QVar16.m_size = (qsizetype)&local_58;
          pQVar8 = (QString *)QString::append(QVar16);
          plVar9 = (long *)QString::append(pQVar8);
          pQVar14 = (QArrayData *)*plVar9;
          local_d8.d.d = (Data *)plVar9[1];
          local_c0.d.d.ptr =
               (QExplicitlySharedDataPointer<QSqlErrorPrivate>)
               ((totally_ordered_wrapper<QSqlErrorPrivate_*> *)(plVar9 + 2))->ptr;
          if (pQVar14 != (QArrayData *)0x0) {
            LOCK();
            (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        (**(code **)(*(long *)&this->super_QSqlQueryModel + 0x1f0))(&local_b8,this);
        if (local_c0.d.d.ptr == (totally_ordered_wrapper<QSqlErrorPrivate_*>)0x0) {
          ppcVar12 = &local_b8.d.ptr;
          pqVar11 = &local_b8.d.size;
          pQVar10 = &(local_b8.d.d)->super_QArrayData;
LAB_0013c09b:
          (__return_storage_ptr__->d).d = (Data *)pQVar10;
          (__return_storage_ptr__->d).ptr = *ppcVar12;
          (__return_storage_ptr__->d).size = *pqVar11;
          if (pQVar10 != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)&pQVar10->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
                 (((QArrayData *)&pQVar10->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
        }
        else {
          if (local_b8.d.size == 0) {
            pqVar11 = (qsizetype *)&local_c0;
            pQVar10 = pQVar14;
            goto LAB_0013c09b;
          }
          local_58.d.ptr = (char16_t *)local_d8.d.d;
          local_58.d.size = (qsizetype)local_c0.d.d.ptr;
          if (pQVar14 != (QArrayData *)0x0) {
            LOCK();
            (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          QVar17.m_data = (char *)0x1;
          QVar17.m_size = (qsizetype)&local_58;
          local_58.d.d = (Data *)pQVar14;
          pQVar8 = (QString *)QString::append(QVar17);
          plVar9 = (long *)QString::append(pQVar8);
          pDVar5 = (Data *)*plVar9;
          (__return_storage_ptr__->d).d = pDVar5;
          (__return_storage_ptr__->d).ptr = (char16_t *)plVar9[1];
          (__return_storage_ptr__->d).size = plVar9[2];
          if (pDVar5 != (Data *)0x0) {
            LOCK();
            (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (pQVar14 != (QArrayData *)0x0) {
          LOCK();
          (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar14->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar14,2,0x10);
          }
        }
        if ((QArrayData *)local_98.a.m_size != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_98.a.m_size)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_98.a.m_size)->_q_value).super___atomic_base<int>._M_i + -1
          ;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_98.a.m_size)->_q_value).super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate((QArrayData *)local_98.a.m_size,2,0x10);
          }
        }
      }
      if ((QArrayData *)local_78.a.m_size != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_78.a.m_size)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_78.a.m_size)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_78.a.m_size)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_78.a.m_size,2,0x10);
        }
      }
      goto LAB_0013bd27;
    }
    local_78.a.m_size = 0x15;
    local_78.a.m_data = "Unable to find table ";
    local_78.b = (QString *)pQVar1;
    QStringBuilder<QLatin1String,_const_QString_&>::convertTo<QString>(&local_58,&local_78);
    local_98.b = (QString *)0x0;
    local_98.a.m_size = 0;
    local_98.a.m_data = (char *)0x0;
    local_b8.d.size = 0;
    local_b8.d.d = (Data *)0x0;
    local_b8.d.ptr = (char16_t *)0x0;
    QSqlError::QSqlError
              ((QSqlError *)&local_d8,&local_58,(QString *)&local_98,StatementError,&local_b8);
    pQVar14 = *(QArrayData **)(lVar3 + 0xe0);
    *(Data **)(lVar3 + 0xe0) = local_d8.d.d;
    local_d8.d.d = (Data *)pQVar14;
    QSqlError::~QSqlError((QSqlError *)&local_d8);
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_98.a.m_size != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_98.a.m_size)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_98.a.m_size)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_98.a.m_size)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_98.a.m_size,2,0x10);
      }
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      iVar2 = ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
      pQVar14 = &(local_58.d.d)->super_QArrayData;
      goto joined_r0x0013bd03;
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
LAB_0013bd27:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QSqlTableModel::selectStatement() const
{
    Q_D(const QSqlTableModel);
    if (d->tableName.isEmpty()) {
        d->error = QSqlError("No table name given"_L1, QString(), QSqlError::StatementError);
        return QString();
    }
    if (d->rec.isEmpty()) {
        d->error = QSqlError("Unable to find table "_L1 + d->tableName, QString(),
                             QSqlError::StatementError);
        return QString();
    }

    const QString stmt = d->db.driver()->sqlStatement(QSqlDriver::SelectStatement,
                                                      d->tableName,
                                                      d->rec,
                                                      false);
    if (stmt.isEmpty()) {
        d->error = QSqlError("Unable to select fields from table "_L1 + d->tableName,
                             QString(), QSqlError::StatementError);
        return stmt;
    }
    return SqlTm::concat(SqlTm::concat(stmt, SqlTm::where(d->filter)), orderByClause());
}